

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O0

OPJ_BOOL opj_jp2_check_color(opj_image_t *image,opj_jp2_color_t *color,opj_event_mgr_t *p_manager)

{
  byte bVar1;
  byte bVar2;
  opj_jp2_cdef_info_t *poVar3;
  opj_jp2_cmap_comp_t *poVar4;
  bool bVar5;
  ushort uVar6;
  void *ptr;
  OPJ_BYTE pcol;
  OPJ_BYTE mtyp;
  OPJ_BOOL is_sane;
  OPJ_BOOL *pcol_usage;
  opj_jp2_cmap_comp_t *cmap;
  uint local_40;
  OPJ_UINT16 nr_channels_1;
  OPJ_UINT32 nr_channels;
  OPJ_UINT16 n;
  opj_jp2_cdef_info_t *info;
  OPJ_UINT16 i;
  opj_event_mgr_t *p_manager_local;
  opj_jp2_color_t *color_local;
  opj_image_t *image_local;
  
  if (color->jp2_cdef != (opj_jp2_cdef_t *)0x0) {
    poVar3 = color->jp2_cdef->info;
    uVar6 = color->jp2_cdef->n;
    local_40 = image->numcomps;
    if ((color->jp2_pclr != (opj_jp2_pclr_t *)0x0) &&
       (color->jp2_pclr->cmap != (opj_jp2_cmap_comp_t *)0x0)) {
      local_40 = (uint)color->jp2_pclr->nr_channels;
    }
    for (info._6_2_ = 0; info._6_2_ < uVar6; info._6_2_ = info._6_2_ + 1) {
      if (local_40 <= poVar3[info._6_2_].cn) {
        opj_event_msg(p_manager,1,"Invalid component index %d (>= %d).\n",
                      (ulong)poVar3[info._6_2_].cn,(ulong)local_40);
        return 0;
      }
      if (((poVar3[info._6_2_].asoc != 0xffff) && (poVar3[info._6_2_].asoc != 0)) &&
         (local_40 <= poVar3[info._6_2_].asoc - 1)) {
        opj_event_msg(p_manager,1,"Invalid component index %d (>= %d).\n",
                      (ulong)(poVar3[info._6_2_].asoc - 1),(ulong)local_40);
        return 0;
      }
    }
    for (; local_40 != 0; local_40 = local_40 - 1) {
      info._6_2_ = 0;
      while ((info._6_2_ < uVar6 && ((uint)poVar3[info._6_2_].cn != local_40 - 1))) {
        info._6_2_ = info._6_2_ + 1;
      }
      if (info._6_2_ == uVar6) {
        opj_event_msg(p_manager,1,"Incomplete channel definitions.\n");
        return 0;
      }
    }
  }
  if ((color->jp2_pclr != (opj_jp2_pclr_t *)0x0) &&
     (color->jp2_pclr->cmap != (opj_jp2_cmap_comp_t *)0x0)) {
    uVar6 = (ushort)color->jp2_pclr->nr_channels;
    poVar4 = color->jp2_pclr->cmap;
    bVar5 = true;
    for (info._6_2_ = 0; info._6_2_ < uVar6; info._6_2_ = info._6_2_ + 1) {
      if (image->numcomps <= (uint)poVar4[info._6_2_].cmp) {
        opj_event_msg(p_manager,1,"Invalid component index %d (>= %d).\n",
                      (ulong)poVar4[info._6_2_].cmp,(ulong)image->numcomps);
        bVar5 = false;
      }
    }
    ptr = opj_calloc((ulong)uVar6,4);
    if (ptr == (void *)0x0) {
      opj_event_msg(p_manager,1,"Unexpected OOM.\n");
      return 0;
    }
    for (info._6_2_ = 0; info._6_2_ < uVar6; info._6_2_ = info._6_2_ + 1) {
      bVar1 = poVar4[info._6_2_].mtyp;
      bVar2 = poVar4[info._6_2_].pcol;
      if ((bVar1 == 0) || (bVar1 == 1)) {
        if (bVar2 < uVar6) {
          if ((*(int *)((long)ptr + (ulong)bVar2 * 4) == 0) || (bVar1 != 1)) {
            if ((bVar1 == 0) && (bVar2 != 0)) {
              opj_event_msg(p_manager,1,"Direct use at #%d however pcol=%d.\n",(ulong)info._6_2_,
                            (ulong)bVar2);
              bVar5 = false;
            }
            else if ((bVar1 == 1) && (bVar2 != info._6_2_)) {
              opj_event_msg(p_manager,1,
                            "Implementation limitation: for palette mapping, pcol[%d] should be equal to %d, but is equal to %d.\n"
                            ,(ulong)info._6_2_,(ulong)info._6_2_,(ulong)bVar2);
              bVar5 = false;
            }
            else {
              *(undefined4 *)((long)ptr + (ulong)bVar2 * 4) = 1;
            }
          }
          else {
            opj_event_msg(p_manager,1,"Component %d is mapped twice.\n",(ulong)bVar2);
            bVar5 = false;
          }
        }
        else {
          opj_event_msg(p_manager,1,"Invalid component/palette index for direct mapping %d.\n",
                        (ulong)bVar2);
          bVar5 = false;
        }
      }
      else {
        opj_event_msg(p_manager,1,"Invalid value for cmap[%d].mtyp = %d.\n",(ulong)info._6_2_,
                      (ulong)bVar1);
        bVar5 = false;
      }
    }
    for (info._6_2_ = 0; info._6_2_ < uVar6; info._6_2_ = info._6_2_ + 1) {
      if ((*(int *)((long)ptr + (ulong)info._6_2_ * 4) == 0) && (poVar4[info._6_2_].mtyp != '\0')) {
        opj_event_msg(p_manager,1,"Component %d doesn\'t have a mapping.\n",(ulong)info._6_2_);
        bVar5 = false;
      }
    }
    if ((bVar5) && (image->numcomps == 1)) {
      for (info._6_2_ = 0; info._6_2_ < uVar6; info._6_2_ = info._6_2_ + 1) {
        if (*(int *)((long)ptr + (ulong)info._6_2_ * 4) == 0) {
          bVar5 = false;
          opj_event_msg(p_manager,2,"Component mapping seems wrong. Trying to correct.\n");
          break;
        }
      }
      if (!bVar5) {
        bVar5 = true;
        for (info._6_2_ = 0; info._6_2_ < uVar6; info._6_2_ = info._6_2_ + 1) {
          poVar4[info._6_2_].mtyp = '\x01';
          poVar4[info._6_2_].pcol = (OPJ_BYTE)info._6_2_;
        }
      }
    }
    opj_free(ptr);
    if (!bVar5) {
      return 0;
    }
  }
  return 1;
}

Assistant:

static OPJ_BOOL opj_jp2_check_color(opj_image_t *image, opj_jp2_color_t *color,
                                    opj_event_mgr_t *p_manager)
{
    OPJ_UINT16 i;

    /* testcase 4149.pdf.SIGSEGV.cf7.3501 */
    if (color->jp2_cdef) {
        opj_jp2_cdef_info_t *info = color->jp2_cdef->info;
        OPJ_UINT16 n = color->jp2_cdef->n;
        OPJ_UINT32 nr_channels =
            image->numcomps; /* FIXME image->numcomps == jp2->numcomps before color is applied ??? */

        /* cdef applies to cmap channels if any */
        if (color->jp2_pclr && color->jp2_pclr->cmap) {
            nr_channels = (OPJ_UINT32)color->jp2_pclr->nr_channels;
        }

        for (i = 0; i < n; i++) {
            if (info[i].cn >= nr_channels) {
                opj_event_msg(p_manager, EVT_ERROR, "Invalid component index %d (>= %d).\n",
                              info[i].cn, nr_channels);
                return OPJ_FALSE;
            }
            if (info[i].asoc == 65535U) {
                continue;
            }

            if (info[i].asoc > 0 && (OPJ_UINT32)(info[i].asoc - 1) >= nr_channels) {
                opj_event_msg(p_manager, EVT_ERROR, "Invalid component index %d (>= %d).\n",
                              info[i].asoc - 1, nr_channels);
                return OPJ_FALSE;
            }
        }

        /* issue 397 */
        /* ISO 15444-1 states that if cdef is present, it shall contain a complete list of channel definitions. */
        while (nr_channels > 0) {
            for (i = 0; i < n; ++i) {
                if ((OPJ_UINT32)info[i].cn == (nr_channels - 1U)) {
                    break;
                }
            }
            if (i == n) {
                opj_event_msg(p_manager, EVT_ERROR, "Incomplete channel definitions.\n");
                return OPJ_FALSE;
            }
            --nr_channels;
        }
    }

    /* testcases 451.pdf.SIGSEGV.f4c.3723, 451.pdf.SIGSEGV.5b5.3723 and
       66ea31acbb0f23a2bbc91f64d69a03f5_signal_sigsegv_13937c0_7030_5725.pdf */
    if (color->jp2_pclr && color->jp2_pclr->cmap) {
        OPJ_UINT16 nr_channels = color->jp2_pclr->nr_channels;
        opj_jp2_cmap_comp_t *cmap = color->jp2_pclr->cmap;
        OPJ_BOOL *pcol_usage, is_sane = OPJ_TRUE;

        /* verify that all original components match an existing one */
        for (i = 0; i < nr_channels; i++) {
            if (cmap[i].cmp >= image->numcomps) {
                opj_event_msg(p_manager, EVT_ERROR, "Invalid component index %d (>= %d).\n",
                              cmap[i].cmp, image->numcomps);
                is_sane = OPJ_FALSE;
            }
        }

        pcol_usage = (OPJ_BOOL *) opj_calloc(nr_channels, sizeof(OPJ_BOOL));
        if (!pcol_usage) {
            opj_event_msg(p_manager, EVT_ERROR, "Unexpected OOM.\n");
            return OPJ_FALSE;
        }
        /* verify that no component is targeted more than once */
        for (i = 0; i < nr_channels; i++) {
            OPJ_BYTE mtyp = cmap[i].mtyp;
            OPJ_BYTE pcol = cmap[i].pcol;
            /* See ISO 15444-1 Table I.14 – MTYPi field values */
            if (mtyp != 0 && mtyp != 1) {
                opj_event_msg(p_manager, EVT_ERROR,
                              "Invalid value for cmap[%d].mtyp = %d.\n", i,
                              mtyp);
                is_sane = OPJ_FALSE;
            } else if (pcol >= nr_channels) {
                opj_event_msg(p_manager, EVT_ERROR,
                              "Invalid component/palette index for direct mapping %d.\n", pcol);
                is_sane = OPJ_FALSE;
            } else if (pcol_usage[pcol] && mtyp == 1) {
                opj_event_msg(p_manager, EVT_ERROR, "Component %d is mapped twice.\n", pcol);
                is_sane = OPJ_FALSE;
            } else if (mtyp == 0 && pcol != 0) {
                /* I.5.3.5 PCOL: If the value of the MTYP field for this channel is 0, then
                 * the value of this field shall be 0. */
                opj_event_msg(p_manager, EVT_ERROR, "Direct use at #%d however pcol=%d.\n", i,
                              pcol);
                is_sane = OPJ_FALSE;
            } else if (mtyp == 1 && pcol != i) {
                /* OpenJPEG implementation limitation. See assert(i == pcol); */
                /* in opj_jp2_apply_pclr() */
                opj_event_msg(p_manager, EVT_ERROR,
                              "Implementation limitation: for palette mapping, "
                              "pcol[%d] should be equal to %d, but is equal "
                              "to %d.\n", i, i, pcol);
                is_sane = OPJ_FALSE;
            } else {
                pcol_usage[pcol] = OPJ_TRUE;
            }
        }
        /* verify that all components are targeted at least once */
        for (i = 0; i < nr_channels; i++) {
            if (!pcol_usage[i] && cmap[i].mtyp != 0) {
                opj_event_msg(p_manager, EVT_ERROR, "Component %d doesn't have a mapping.\n",
                              i);
                is_sane = OPJ_FALSE;
            }
        }
        /* Issue 235/447 weird cmap */
        if (1 && is_sane && (image->numcomps == 1U)) {
            for (i = 0; i < nr_channels; i++) {
                if (!pcol_usage[i]) {
                    is_sane = 0U;
                    opj_event_msg(p_manager, EVT_WARNING,
                                  "Component mapping seems wrong. Trying to correct.\n");
                    break;
                }
            }
            if (!is_sane) {
                is_sane = OPJ_TRUE;
                for (i = 0; i < nr_channels; i++) {
                    cmap[i].mtyp = 1U;
                    cmap[i].pcol = (OPJ_BYTE) i;
                }
            }
        }
        opj_free(pcol_usage);
        if (!is_sane) {
            return OPJ_FALSE;
        }
    }

    return OPJ_TRUE;
}